

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

mi_page_t *
mi_segments_page_alloc
          (mi_heap_t *heap,mi_page_kind_t page_kind,size_t required,size_t block_size,
          mi_segments_tld_t *tld)

{
  mi_segments_tld_t *tld_00;
  mi_heap_t *pmVar1;
  mi_segments_tld_t *pmVar2;
  _Bool _Var3;
  _Bool _Var4;
  mi_segment_t *pmVar5;
  long lVar6;
  mi_segment_t *pmVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t slice_count;
  ulong uVar11;
  mi_segment_t *segment;
  mi_heap_t *heap_00;
  undefined4 in_register_00000034;
  mi_page_t *unaff_R14;
  mi_slice_t *slice;
  bool bVar12;
  char cVar13;
  _Bool reclaimed;
  mi_arena_field_cursor_t current;
  _Bool local_a1;
  mi_segments_tld_t *local_a0;
  mi_heap_t *local_98;
  mi_segment_t *local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  mi_span_queue_t *local_68;
  mi_arena_field_cursor_t local_60;
  
  local_80 = CONCAT44(in_register_00000034,page_kind);
  uVar10 = 0xffffffffffff0000;
  if (0x80000 < local_80) {
    uVar10 = 0xfffffffffff80000;
  }
  uVar11 = local_80 + 0xffff;
  if (0x80000 < local_80) {
    uVar11 = local_80 + 0x7ffff;
  }
  local_78 = (uVar11 & uVar10) >> 0x10;
  uVar8 = local_78;
  if (0x1ffff < (uVar11 & uVar10)) {
    uVar10 = local_78 - 1;
    uVar11 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    if (2 < uVar11) {
      uVar8 = ((ulong)((uint)(uVar10 >> (0x3d - ((byte)uVar11 ^ 0x3f) & 0x3f)) & 3) + uVar11 * 4) -
              4;
    }
  }
  uVar10 = local_78 + (local_78 == 0);
  local_a0 = (mi_segments_tld_t *)block_size;
  local_98 = heap;
  local_88 = required;
  if ((long)uVar8 < 0x24) {
    local_90 = (mi_segment_t *)CONCAT44(local_90._4_4_,heap->arena_id);
    lVar9 = uVar8 * 0x18;
    do {
      slice = *(mi_slice_t **)((long)&local_a0->spans[0].first + lVar9);
      bVar12 = slice == (mi_slice_t *)0x0;
      local_70 = lVar9;
      if (!bVar12) {
        local_68 = (mi_span_queue_t *)((long)&local_a0->spans[0].first + lVar9);
        do {
          if (uVar10 <= slice->slice_count) {
            pmVar5 = (mi_segment_t *)((ulong)((long)slice[-1].padding + 7U) & 0xfffffffffe000000);
            pmVar7 = (mi_segment_t *)0x0;
            if (0 < (long)pmVar5) {
              pmVar7 = pmVar5;
            }
            _Var3 = _mi_arena_memid_is_suitable(pmVar7->memid,(mi_arena_id_t)local_90);
            if (_Var3) {
              mi_span_queue_delete(local_68,slice);
              slice_count = slice->slice_count - uVar10;
              if (uVar10 <= slice->slice_count && slice_count != 0) {
                tld = local_a0;
                mi_segment_span_free
                          (pmVar7,((long)slice + (-0x120 - (long)pmVar7) >> 5) * -0x5555555555555555
                                  + uVar10,slice_count,false,local_a0);
                slice->slice_count = (uint32_t)uVar10;
              }
              unaff_R14 = mi_segment_span_allocate
                                    (pmVar7,((long)slice + (-0x120 - (long)pmVar7) >> 5) *
                                            -0x5555555555555555,(ulong)slice->slice_count);
              if (unaff_R14 == (mi_page_t *)0x0) {
                mi_segment_span_free_coalesce(slice,local_a0);
                unaff_R14 = (mi_page_t *)0x0;
              }
            }
            if (_Var3) break;
          }
          slice = slice->next;
          bVar12 = slice == (mi_page_s *)0x0;
        } while (!bVar12);
      }
      if (!bVar12) goto LAB_00473526;
      lVar9 = local_70 + 0x18;
    } while (local_70 < 0x331);
  }
  unaff_R14 = (mi_page_t *)0x0;
LAB_00473526:
  if (unaff_R14 == (mi_page_t *)0x0) {
    uVar10 = mi_option_get_clamp(mi_option_target_segments_per_thread,0,0x400);
    heap_00 = local_98;
    if ((uVar10 != 0) && (uVar10 <= local_a0->count)) {
      mi_segments_try_abandon_to_target(local_98,uVar10,local_a0);
    }
    local_a1 = false;
    lVar6 = mi_option_get_clamp(mi_option_max_segment_reclaim,0,100);
    lVar9 = 0;
    if (lVar6 != 0) {
      uVar10 = local_a0->subproc->abandoned_count;
      if (uVar10 == 0) {
        lVar9 = 0;
      }
      else {
        if (uVar10 < 0x2711) {
          uVar11 = (lVar6 * uVar10) / 100;
        }
        else {
          uVar11 = (uVar10 / 100) * lVar6;
        }
        uVar8 = 0x400;
        if (uVar11 < 0x400) {
          uVar8 = uVar11;
        }
        lVar6 = uVar8 + (uVar8 == 0);
        lVar9 = 8;
        if (7 < uVar11) {
          lVar9 = lVar6;
        }
        if (uVar10 < 9) {
          lVar9 = lVar6;
        }
      }
    }
    if (lVar9 < 1) {
      bVar12 = false;
    }
    else {
      local_90 = (mi_segment_t *)0x0;
      _mi_arena_field_cursor_init(heap_00,local_a0->subproc,false,&local_60);
      tld_00 = local_a0;
      do {
        uVar10 = mi_option_get_clamp(mi_option_target_segments_per_thread,0,0x400);
        if ((((uVar10 != 0) && (uVar10 <= local_a0->count)) || (lVar9 < 1)) ||
           (pmVar7 = _mi_arena_segment_clear_abandoned_next(&local_60),
           pmVar7 == (mi_segment_t *)0x0)) break;
        pmVar7->abandoned_visits = pmVar7->abandoned_visits + 1;
        _Var3 = _mi_heap_memid_is_suitable(heap_00,pmVar7->memid);
        _Var4 = mi_segment_check_free(pmVar7,local_78,local_88,tld_00);
        pmVar1 = local_98;
        pmVar2 = tld_00;
        if (pmVar7->used == 0) {
LAB_0047374d:
          tld = pmVar2;
          mi_segment_reclaim(pmVar7,heap_00,0,(_Bool *)0x0,tld);
          bVar12 = true;
          lVar9 = lVar9 + -1;
        }
        else if (_Var4 && _Var3) {
          tld = local_a0;
          local_90 = mi_segment_reclaim(pmVar7,local_98,local_88,&local_a1,local_a0);
          bVar12 = false;
          heap_00 = pmVar1;
          lVar9 = lVar9 + -1;
        }
        else {
          heap_00 = local_98;
          pmVar2 = local_a0;
          if (3 < pmVar7->abandoned_visits && _Var3) goto LAB_0047374d;
          mi_segment_try_purge(pmVar7,false);
          _mi_arena_segment_mark_abandoned(pmVar7);
          bVar12 = true;
          heap_00 = local_98;
        }
      } while (bVar12);
      _mi_arena_field_cursor_done(&local_60);
      bVar12 = local_90 != (mi_segment_t *)0x0;
    }
    cVar13 = local_a1;
    if ((local_a1 == false) && (!bVar12)) {
      tld = (mi_segments_tld_t *)0x0;
      pmVar7 = mi_segment_alloc(0,0,heap_00->arena_id,local_a0,(mi_page_t **)0x0);
      cVar13 = pmVar7 == (mi_segment_t *)0x0;
    }
    if (cVar13 == '\0') {
      unaff_R14 = mi_segments_page_alloc
                            (heap_00,(mi_page_kind_t)local_80,local_88,(size_t)local_a0,tld);
    }
    else {
      unaff_R14 = (mi_page_t *)0x0;
    }
  }
  else {
    pmVar5 = (mi_segment_t *)((ulong)((long)unaff_R14[-1].padding + 7U) & 0xfffffffffe000000);
    pmVar7 = (mi_segment_t *)0x0;
    if (0 < (long)pmVar5) {
      pmVar7 = pmVar5;
    }
    mi_segment_try_purge(pmVar7,false);
  }
  return unaff_R14;
}

Assistant:

static mi_page_t* mi_segments_page_alloc(mi_heap_t* heap, mi_page_kind_t page_kind, size_t required, size_t block_size, mi_segments_tld_t* tld)
{
  mi_assert_internal(required <= MI_LARGE_OBJ_SIZE_MAX && page_kind <= MI_PAGE_LARGE);

  // find a free page
  size_t page_size = _mi_align_up(required, (required > MI_MEDIUM_PAGE_SIZE ? MI_MEDIUM_PAGE_SIZE : MI_SEGMENT_SLICE_SIZE));
  size_t slices_needed = page_size / MI_SEGMENT_SLICE_SIZE;
  mi_assert_internal(slices_needed * MI_SEGMENT_SLICE_SIZE == page_size);
  mi_page_t* page = mi_segments_page_find_and_allocate(slices_needed, heap->arena_id, tld); //(required <= MI_SMALL_SIZE_MAX ? 0 : slices_needed), tld);
  if (page==NULL) {
    // no free page, allocate a new segment and try again
    if (mi_segment_reclaim_or_alloc(heap, slices_needed, block_size, tld) == NULL) {
      // OOM or reclaimed a good page in the heap
      return NULL;
    }
    else {
      // otherwise try again
      return mi_segments_page_alloc(heap, page_kind, required, block_size, tld);
    }
  }
  mi_assert_internal(page != NULL && page->slice_count*MI_SEGMENT_SLICE_SIZE == page_size);
  mi_assert_internal(_mi_ptr_segment(page)->thread_id == _mi_thread_id());
  mi_segment_try_purge(_mi_ptr_segment(page), false);
  return page;
}